

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::EnhancedLayouts::TextureTestBase::getPassSnippet_abi_cxx11_
          (string *__return_storage_ptr__,TextureTestBase *this,GLuint param_1,
          VaryingPassthrough *varying_passthrough,STAGES stage)

{
  Variable *pVVar1;
  Variable *pVVar2;
  Vector *pVVar3;
  pointer pVVar4;
  ulong uVar5;
  FLAVOUR in_flavour;
  uint uVar6;
  size_t position;
  string local_a8;
  string local_88;
  ulong local_68;
  Vector *local_60;
  TextureTestBase *local_58;
  string passthrough;
  
  local_58 = this;
  if (stage == COMPUTE) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,0x1b32ab9);
  }
  else {
    pVVar3 = Utils::VaryingPassthrough::Get(varying_passthrough,stage);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"LIST","");
    position = 0;
    pVVar4 = (pVVar3->
             super__Vector_base<gl4cts::EnhancedLayouts::Utils::VaryingConnection,_std::allocator<gl4cts::EnhancedLayouts::Utils::VaryingConnection>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_60 = pVVar3;
    if ((pVVar3->
        super__Vector_base<gl4cts::EnhancedLayouts::Utils::VaryingConnection,_std::allocator<gl4cts::EnhancedLayouts::Utils::VaryingConnection>_>
        )._M_impl.super__Vector_impl_data._M_finish != pVVar4) {
      local_68 = (ulong)((uint)(stage == TESS_CTRL) * 2);
      uVar6 = 1;
      uVar5 = 0;
      do {
        in_flavour = BASIC;
        if (stage - TESS_CTRL < 3) {
          in_flavour = *(FLAVOUR *)(&DAT_01a43240 + (ulong)(stage - TESS_CTRL) * 4);
        }
        pVVar1 = pVVar4[uVar5].m_in;
        pVVar2 = pVVar4[uVar5].m_out;
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,0x1b32ab9,0x1b32ab9);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,0x1b32ab9,0x1b32ab9);
        getVariablePassthrough
                  (&passthrough,local_58,&local_a8,&pVVar1->m_descriptor,in_flavour,&local_88,
                   &pVVar2->m_descriptor,(FLAVOUR)local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        Utils::insertElementOfList
                  (passthrough._M_dataplus._M_p,"\n    ",&position,__return_storage_ptr__);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)passthrough._M_dataplus._M_p != &passthrough.field_2) {
          operator_delete(passthrough._M_dataplus._M_p,passthrough.field_2._M_allocated_capacity + 1
                         );
        }
        uVar5 = (ulong)uVar6;
        pVVar4 = (local_60->
                 super__Vector_base<gl4cts::EnhancedLayouts::Utils::VaryingConnection,_std::allocator<gl4cts::EnhancedLayouts::Utils::VaryingConnection>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar6 = uVar6 + 1;
      } while (uVar5 < (ulong)((long)(local_60->
                                     super__Vector_base<gl4cts::EnhancedLayouts::Utils::VaryingConnection,_std::allocator<gl4cts::EnhancedLayouts::Utils::VaryingConnection>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4 >> 4
                              ));
    }
    Utils::endList(glcts::fixed_sample_locations_values + 1,&position,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TextureTestBase::getPassSnippet(GLuint /* test_case_index */,
											Utils::VaryingPassthrough& varying_passthrough, Utils::Shader::STAGES stage)
{
	static const GLchar* separator = "\n    ";

	/* Skip for compute shader */
	if (Utils::Shader::COMPUTE == stage)
	{
		return "";
	}

	Utils::VaryingConnection::Vector& vector = varying_passthrough.Get(stage);

	std::string result   = Utils::g_list;
	size_t		position = 0;

	for (GLuint i = 0; i < vector.size(); ++i)
	{

		Utils::VaryingConnection& connection = vector[i];

		Utils::Variable* in  = connection.m_in;
		Utils::Variable* out = connection.m_out;

		Utils::Variable::FLAVOUR in_flavour  = Utils::Variable::GetFlavour(stage, Utils::Variable::INPUT);
		Utils::Variable::FLAVOUR out_flavour = Utils::Variable::GetFlavour(stage, Utils::Variable::OUTPUT);

		const std::string passthrough =
			getVariablePassthrough("", in->m_descriptor, in_flavour, "", out->m_descriptor, out_flavour);

		Utils::insertElementOfList(passthrough.c_str(), separator, position, result);
	}

	Utils::endList("", position, result);

	return result;
}